

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

void __thiscall slang::SVInt::setAllOnes(SVInt *this)

{
  uint64_t *puVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  bitwidth_t bVar5;
  
  if ((this->super_SVIntStorage).unknownFlag == false) {
    bVar5 = (this->super_SVIntStorage).bitWidth;
    bVar3 = 0;
  }
  else {
    (this->super_SVIntStorage).unknownFlag = false;
    puVar1 = (this->super_SVIntStorage).field_0.pVal;
    if (puVar1 == (uint64_t *)0x0) {
      bVar3 = 0;
    }
    else {
      operator_delete__(puVar1);
      bVar3 = (this->super_SVIntStorage).unknownFlag;
    }
    bVar5 = (this->super_SVIntStorage).bitWidth;
    uVar4 = (bVar5 + 0x3f >> 6) << (bVar3 & 0x1f);
    if (1 < uVar4) {
      puVar1 = (uint64_t *)operator_new__((ulong)(uVar4 << 3));
      (this->super_SVIntStorage).field_0.pVal = puVar1;
    }
  }
  if (bVar5 < 0x41 && (bVar3 & 1) == 0) {
    (this->super_SVIntStorage).field_0.val = 0xffffffffffffffff;
  }
  else if (0x3f < bVar5 + 0x3f) {
    uVar2 = 0;
    do {
      (this->super_SVIntStorage).field_0.pVal[uVar2] = 0xffffffffffffffff;
      uVar2 = uVar2 + 1;
    } while ((bVar5 + 0x3f >> 6) << (bVar3 & 0x1f) != uVar2);
  }
  clearUnusedBits(this);
  return;
}

Assistant:

void SVInt::setAllOnes() {
    // we don't have unknown digits anymore, so reallocate if necessary
    if (unknownFlag) {
        unknownFlag = false;
        delete[] pVal;
        if (getNumWords() > 1)
            pVal = new uint64_t[getNumWords()];
    }

    if (isSingleWord())
        val = UINT64_MAX;
    else {
        for (uint32_t i = 0; i < getNumWords(); i++)
            pVal[i] = UINT64_MAX;
    }
    clearUnusedBits();
}